

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c
# Opt level: O1

void rd_6dim_slice(char **content,size_t *line_no,int *array,int *dim,int *shift,int *post)

{
  int iVar1;
  
  if (int22_post[0] + int22_post[1] + int22_post[2] + int22_post[3] + int22_post[4] + int22_post[5]
      + int22_shift[1] + int22_shift[0] + int22_shift[2] + int22_shift[3] + int22_shift[4] +
        int22_shift[5] != 0) {
    iVar1 = int22_shift[0];
    if (int22_shift[0] < int22_dim[0] - int22_post[0]) {
      do {
        rd_5dim_slice(content,line_no,
                      array + (long)int22_dim[5] * (long)int22_dim[4] *
                              (long)int22_dim[3] * (long)int22_dim[2] *
                              (long)int22_dim[1] * (long)iVar1,int22_dim + 1,int22_shift + 1,
                      int22_post + 1);
        iVar1 = iVar1 + 1;
      } while (iVar1 < int22_dim[0] - int22_post[0]);
    }
    return;
  }
  rd_1dim_slice(content,line_no,array,
                int22_dim[0] * int22_dim[1] * int22_dim[2] * int22_dim[3] * int22_dim[4] *
                int22_dim[5],0,0);
  return;
}

Assistant:

PRIVATE void
rd_6dim_slice(char    **content,
              size_t  *line_no,
              int     *array,
              int     dim[6],
              int     shift[6],
              int     post[6])
{
  int i;
  int delta_pre   = shift[0] + shift[1] + shift[2] + shift[3] + shift[4] + shift[5];
  int delta_post  = post[0] + post[1] + post[2] + post[3] + post[4] + post[5];

  if (delta_pre + delta_post == 0) {
    rd_1dim(content, line_no, array, dim[0] * dim[1] * dim[2] * dim[3] * dim[4] * dim[5], 0);
    return;
  }

  for (i = shift[0]; i < dim[0] - post[0]; i++)
    rd_5dim_slice(content, line_no, array + (i * dim[1] * dim[2] * dim[3] * dim[4] * dim[5]),
                  dim + 1,
                  shift + 1,
                  post + 1);
  return;
}